

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arrow_type_extension.cpp
# Opt level: O0

void duckdb::ArrowBit::PopulateSchema
               (DuckDBArrowSchemaHolder *root_holder,ArrowSchema *schema,LogicalType *type,
               ClientContext *context,ArrowTypeExtension *extension)

{
  ArrowSchemaMetadata *this;
  pointer pcVar1;
  undefined8 *in_RSI;
  long in_RDI;
  ClientProperties options;
  ArrowSchemaMetadata schema_metadata;
  ArrowTypeExtension *in_stack_fffffffffffffdf8;
  ArrowExtensionMetadata *in_stack_fffffffffffffe00;
  unique_ptr<char[],_std::default_delete<char>,_false> *__args;
  vector<duckdb::unique_ptr<char[],_std::default_delete<char>,_false>,_std::allocator<duckdb::unique_ptr<char[],_std::default_delete<char>,_false>_>_>
  *in_stack_fffffffffffffe10;
  char local_1d0;
  vector<duckdb::unique_ptr<char[],_std::default_delete<char>,_false>,_true>
  *in_stack_fffffffffffffe40;
  ArrowSchemaMetadata *in_stack_fffffffffffffe98;
  string local_138 [48];
  unique_ptr<char[],_std::default_delete<char>,_false> local_108 [11];
  string *in_stack_ffffffffffffff50;
  string *in_stack_ffffffffffffff58;
  ClientContext *in_stack_ffffffffffffff68;
  string local_88 [120];
  undefined8 *local_10;
  long local_8;
  
  __args = local_108;
  local_10 = in_RSI;
  local_8 = in_RDI;
  ArrowTypeExtension::GetInfo(in_stack_fffffffffffffdf8);
  ArrowExtensionMetadata::GetTypeName_abi_cxx11_
            ((ArrowExtensionMetadata *)in_stack_fffffffffffffdf8);
  ArrowTypeExtension::GetInfo(in_stack_fffffffffffffdf8);
  ArrowExtensionMetadata::GetVendorName_abi_cxx11_
            ((ArrowExtensionMetadata *)in_stack_fffffffffffffdf8);
  ArrowSchemaMetadata::NonCanonicalType(in_stack_ffffffffffffff58,in_stack_ffffffffffffff50);
  ::std::__cxx11::string::~string(local_138);
  ArrowExtensionMetadata::~ArrowExtensionMetadata(in_stack_fffffffffffffe00);
  ::std::__cxx11::string::~string(local_88);
  ArrowExtensionMetadata::~ArrowExtensionMetadata(in_stack_fffffffffffffe00);
  this = (ArrowSchemaMetadata *)(local_8 + 0x90);
  ArrowSchemaMetadata::SerializeMetadata(in_stack_fffffffffffffe98);
  ::std::
  vector<duckdb::unique_ptr<char[],std::default_delete<char>,false>,std::allocator<duckdb::unique_ptr<char[],std::default_delete<char>,false>>>
  ::emplace_back<duckdb::unique_ptr<char[],std::default_delete<char>,false>>
            (in_stack_fffffffffffffe10,__args);
  unique_ptr<char[],_std::default_delete<char>,_false>::~unique_ptr
            ((unique_ptr<char[],_std::default_delete<char>,_false> *)0x152ec77);
  vector<duckdb::unique_ptr<char[],_std::default_delete<char>,_false>,_true>::back
            (in_stack_fffffffffffffe40);
  pcVar1 = ::std::unique_ptr<char[],_std::default_delete<char[]>_>::get
                     ((unique_ptr<char[],_std::default_delete<char[]>_> *)this);
  local_10[2] = pcVar1;
  ClientContext::GetClientProperties(in_stack_ffffffffffffff68);
  if (local_1d0 == '\x01') {
    *local_10 = "Z";
  }
  else {
    *local_10 = "z";
  }
  ClientProperties::~ClientProperties((ClientProperties *)0x152edba);
  ArrowSchemaMetadata::~ArrowSchemaMetadata(this);
  return;
}

Assistant:

static void PopulateSchema(DuckDBArrowSchemaHolder &root_holder, ArrowSchema &schema, const LogicalType &type,
	                           ClientContext &context, const ArrowTypeExtension &extension) {
		const ArrowSchemaMetadata schema_metadata = ArrowSchemaMetadata::NonCanonicalType(
		    extension.GetInfo().GetTypeName(), extension.GetInfo().GetVendorName());
		root_holder.metadata_info.emplace_back(schema_metadata.SerializeMetadata());
		schema.metadata = root_holder.metadata_info.back().get();
		const auto options = context.GetClientProperties();
		if (options.arrow_offset_size == ArrowOffsetSize::LARGE) {
			schema.format = "Z";
		} else {
			schema.format = "z";
		}
	}